

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::SwapObjects(NULLCRef l,NULLCRef r)

{
  uint uVar1;
  uint uVar2;
  undefined1 *__dest;
  char *__function;
  ulong __n;
  char tmpStack [512];
  undefined1 auStack_228 [520];
  
  __dest = auStack_228;
  if (tmpStack._8_4_ == tmpStack._24_4_) {
    if ((uint)tmpStack._8_4_ < *(uint *)(linker + 0x20c)) {
      uVar1 = *(uint *)(*(long *)(linker + 0x200) + 4 + (ulong)(uint)tmpStack._8_4_ * 0x50);
      __n = (ulong)uVar1;
      if (0x1ff < __n) {
        __dest = (undefined1 *)AllocObject(uVar1,tmpStack._8_4_);
      }
      memcpy(__dest,(void *)tmpStack._12_8_,__n);
      memcpy((void *)tmpStack._12_8_,(void *)tmpStack._28_8_,__n);
      memcpy((void *)tmpStack._28_8_,__dest,__n);
      return;
    }
  }
  else if ((uint)tmpStack._24_4_ < *(uint *)(linker + 0x20c)) {
    uVar1 = *(uint *)(*(long *)(linker + 0x200) + (ulong)(uint)tmpStack._24_4_ * 0x50);
    if (uVar1 < *(uint *)(linker + 0x29c)) {
      if (*(uint *)(linker + 0x20c) <= (uint)tmpStack._8_4_) goto LAB_0021fd21;
      uVar2 = *(uint *)(*(long *)(linker + 0x200) + (ulong)(uint)tmpStack._8_4_ * 0x50);
      if (uVar2 < *(uint *)(linker + 0x29c)) {
        nullcThrowError("ERROR: types don\'t match (%s ref, %s ref)",
                        (ulong)uVar1 + *(long *)(linker + 0x290),
                        (ulong)uVar2 + *(long *)(linker + 0x290));
        return;
      }
    }
    __function = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_0021fd4d;
  }
LAB_0021fd21:
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0021fd4d:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
}

Assistant:

void NULLC::SwapObjects(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: types don't match (%s ref, %s ref)", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return;
	}
	unsigned size = linker->exTypes[l.typeID].size;

	char tmpStack[512];
	// $$ should use some extendable static storage for big objects
	char *tmp = size < 512 ? tmpStack : (char*)NULLC::AllocObject(size, l.typeID);
	memcpy(tmp, l.ptr, size);
	memcpy(l.ptr, r.ptr, size);
	memcpy(r.ptr, tmp, size);
}